

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

unique_ptr<Catch::Generators::SingleValueGenerator<unary_op_tuple<trng::portable_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<Catch::Generators::SingleValueGenerator<unary_op_tuple<trng::portable_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
 __thiscall
Catch::Generators::pf::
make_unique<Catch::Generators::SingleValueGenerator<unary_op_tuple<trng::portable_impl::uint128,std::__cxx11::string>>,unary_op_tuple<trng::portable_impl::uint128,std::__cxx11::string>>
          (pf *this,
          unary_op_tuple<trng::portable_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  uint64_t uVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  
  puVar5 = (undefined8 *)operator_new(0x38);
  *puVar5 = &PTR__SingleValueGenerator_003199c0;
  uVar3 = (args->a).m_hi;
  puVar5[1] = (args->a).m_lo;
  puVar5[2] = uVar3;
  puVar5[3] = puVar5 + 5;
  pcVar2 = (args->y)._M_dataplus._M_p;
  paVar1 = &(args->y).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar4 = *(undefined8 *)((long)&(args->y).field_2 + 8);
    puVar5[5] = paVar1->_M_allocated_capacity;
    puVar5[6] = uVar4;
  }
  else {
    puVar5[3] = pcVar2;
    puVar5[5] = paVar1->_M_allocated_capacity;
  }
  puVar5[4] = (args->y)._M_string_length;
  (args->y)._M_dataplus._M_p = (pointer)paVar1;
  (args->y)._M_string_length = 0;
  (args->y).field_2._M_local_buf[0] = '\0';
  *(undefined8 **)this = puVar5;
  return (__uniq_ptr_data<Catch::Generators::SingleValueGenerator<unary_op_tuple<trng::portable_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<Catch::Generators::SingleValueGenerator<unary_op_tuple<trng::portable_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_true>
          )(__uniq_ptr_data<Catch::Generators::SingleValueGenerator<unary_op_tuple<trng::portable_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<Catch::Generators::SingleValueGenerator<unary_op_tuple<trng::portable_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> make_unique( Args&&... args ) {
            return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
        }